

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O3

void __thiscall
Assimp::D3MFImporter::InternReadFile
          (D3MFImporter *this,string *filename,aiScene *pScene,IOSystem *pIOHandler)

{
  CIrrXML_IOStreamReader *this_00;
  IOStream *_stream;
  IrrXMLReader *pIVar1;
  D3MFOpcPackage opcPackage;
  XmlSerializer xmlSerializer;
  D3MFOpcPackage DStack_b8;
  XmlSerializer local_a8;
  
  D3MF::D3MFOpcPackage::D3MFOpcPackage(&DStack_b8,pIOHandler,filename);
  this_00 = (CIrrXML_IOStreamReader *)operator_new(0x30);
  _stream = D3MF::D3MFOpcPackage::RootStream(&DStack_b8);
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_00,_stream);
  pIVar1 = irr::io::createIrrXMLReader((IFileReadCallBack *)this_00);
  local_a8.mMatId2MatArray._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8.mMatId2MatArray._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8.mMatArray.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mMatArray.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.mMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.mMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.mMetaData.
  super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.mMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mMetaData.
  super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mMetaData.
  super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.mMatArray.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.mActiveMatGroup = 99999999;
  local_a8.mMatId2MatArray._M_t._M_impl._0_8_ = 0;
  local_a8.mMatId2MatArray._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.mMatId2MatArray._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8.mMatId2MatArray._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.mMatId2MatArray._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.mMatId2MatArray._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8.mMatId2MatArray._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8.xmlReader = pIVar1;
  D3MF::XmlSerializer::ImportXml(&local_a8,pScene);
  D3MF::XmlSerializer::~XmlSerializer(&local_a8);
  if (pIVar1 != (IrrXMLReader *)0x0) {
    (*pIVar1->_vptr_IIrrXMLReader[1])(pIVar1);
  }
  (*(this_00->super_IFileReadCallBack)._vptr_IFileReadCallBack[1])(this_00);
  D3MF::D3MFOpcPackage::~D3MFOpcPackage(&DStack_b8);
  return;
}

Assistant:

void D3MFImporter::InternReadFile( const std::string &filename, aiScene *pScene, IOSystem *pIOHandler ) {
    D3MF::D3MFOpcPackage opcPackage(pIOHandler, filename);

    std::unique_ptr<CIrrXML_IOStreamReader> xmlStream(new CIrrXML_IOStreamReader(opcPackage.RootStream()));
    std::unique_ptr<D3MF::XmlReader> xmlReader(irr::io::createIrrXMLReader(xmlStream.get()));

    D3MF::XmlSerializer xmlSerializer(xmlReader.get());

    xmlSerializer.ImportXml(pScene);
}